

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

void __thiscall
helics::ValueFederateManager::addTarget(ValueFederateManager *this,Input *inp,string_view target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ValueFederate *pVVar2;
  _func_int *p_Var3;
  _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
  *p_Var4;
  bool bVar5;
  size_t __n;
  char *__s1;
  ValueFederateManager *pVVar6;
  int iVar7;
  _Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var8;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 uVar12;
  InterfaceHandle *__args;
  size_type __rlen;
  string_view message;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar13;
  handle iTHandle;
  handle local_110;
  undefined8 uStack_f8;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  InterfaceHandle *local_e0;
  ValueFederateManager *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  handle local_48;
  
  local_f0._M_str = target._M_str;
  local_f0._M_len = target._M_len;
  local_90 = &this->inputTargets;
  local_d8 = this;
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  ::lock(&local_48,local_90);
  local_e0 = &(inp->super_Interface).handle;
  pVar13 = std::
           _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::equal_range(&(local_48.data)->_M_t,local_e0);
  __s1 = local_f0._M_str;
  __n = local_f0._M_len;
  _Var8 = pVar13.first._M_node;
  do {
    bVar5 = _Var8._M_node == pVar13.second._M_node._M_node;
    if (bVar5) {
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
      __args = local_e0;
LAB_00212800:
      pVVar6 = local_d8;
      (*local_d8->coreObject->_vptr_Core[0x3e])
                (local_d8->coreObject,(ulong)(uint)__args->hid,local_f0._M_len,local_f0._M_str,0x75)
      ;
      gmlc::libguarded::
      shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
      ::lock(&local_110,local_90);
      std::
      _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
      ::
      _M_emplace_equal<helics::InterfaceHandle_const&,std::basic_string_view<char,std::char_traits<char>>&>
                ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
                  *)local_110.data,__args,&local_f0);
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_110.m_handle_lock);
      gmlc::libguarded::
      shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
      ::lock((handle *)&local_110,&pVVar6->targetIDs);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
      ::
      _M_emplace_equal<std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
                  *)local_110.data,&local_f0,__args);
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_110.m_handle_lock);
      return;
    }
    if (((_Base_ptr)__n == _Var8._M_node[1]._M_left) &&
       (((_Base_ptr)__n == (_Base_ptr)0x0 ||
        (iVar7 = bcmp(__s1,_Var8._M_node[1]._M_parent,__n), iVar7 == 0)))) {
      pVVar2 = local_d8->fed;
      p_Var3 = pVVar2->_vptr_ValueFederate[-3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Duplicate input targets detected for ","");
      iVar7 = (*(inp->super_Interface)._vptr_Interface[4])(inp);
      pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_68,*(char **)CONCAT44(extraout_var,iVar7),
                           ((undefined8 *)CONCAT44(extraout_var,iVar7))[1]);
      local_88._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar10 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == paVar10) {
        local_88.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_88._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::append(&local_88,"::");
      paVar10 = &local_d0.field_2;
      local_d0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar11 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == paVar11) {
        local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_d0.field_2._8_4_ = *(undefined4 *)((long)&pbVar9->field_2 + 8);
        local_d0.field_2._12_4_ = *(undefined4 *)((long)&pbVar9->field_2 + 0xc);
        local_d0._M_dataplus._M_p = (pointer)paVar10;
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_d0._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      paVar11 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,local_f0._M_str,
                 local_f0._M_str + (long)(_Rb_tree_color *)local_f0._M_len);
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar10) {
        uVar12 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_b0._M_string_length + local_d0._M_string_length) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar11) {
          uVar12 = local_b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_b0._M_string_length + local_d0._M_string_length)
        goto LAB_002129fa;
        pbVar9 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                           (&local_b0,0,0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      }
      else {
LAB_002129fa:
        pbVar9 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                           (&local_d0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      }
      local_110.data = (pointer)&local_110.m_handle_lock._M_owns;
      p_Var4 = (_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
                *)(pbVar9->_M_dataplus)._M_p;
      paVar1 = &pbVar9->field_2;
      if (p_Var4 == (_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
                     *)paVar1) {
        local_110.m_handle_lock._8_8_ = paVar1->_M_allocated_capacity;
        uStack_f8 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      }
      else {
        local_110.m_handle_lock._8_8_ = paVar1->_M_allocated_capacity;
        local_110.data = (pointer)p_Var4;
      }
      local_110.m_handle_lock._M_device = (mutex_type *)pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar1;
      pbVar9->_M_string_length = 0;
      paVar1->_M_local_buf[0] = '\0';
      message._M_str = (char *)local_110.data;
      message._M_len = (size_t)local_110.m_handle_lock._M_device;
      Federate::logMessage
                ((Federate *)((long)&pVVar2->_vptr_ValueFederate + (long)p_Var3),3,message);
      __args = local_e0;
      if (local_110.data != (pointer)&local_110.m_handle_lock._M_owns) {
        operator_delete(local_110.data,local_110.m_handle_lock._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar11) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar10) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
      if (!bVar5) {
        return;
      }
      goto LAB_00212800;
    }
    _Var8._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var8._M_node);
  } while( true );
}

Assistant:

void ValueFederateManager::addTarget(const Input& inp, std::string_view target)
{
    {
        auto iTHandle = inputTargets.lock();
        auto rng = iTHandle->equal_range(inp.handle);
        for (auto el = rng.first; el != rng.second; ++el) {
            if (el->second == target) {
                fed->logWarningMessage(std::string("Duplicate input targets detected for ") +
                                       inp.getDisplayName() + "::" + std::string(target));
                return;
            }
        }
    }

    coreObject->addSourceTarget(inp.handle, target);

    inputTargets.lock()->emplace(inp.handle, target);
    targetIDs.lock()->emplace(target, inp.handle);
}